

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QGraphicsItem * __thiscall QGraphicsItem::mapFromParent(QGraphicsItem *this,QPainterPath *path)

{
  QGraphicsItemPrivate *this_00;
  long lVar1;
  undefined8 *puVar2;
  QTransform *pQVar3;
  long in_FS_OFFSET;
  QTransform matrix;
  QTransform QStack_c8;
  bool local_78 [80];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsItemPrivate **)(path + 8);
  if (this_00->transformData == (TransformData *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QPainterPath::translated(-(this_00->pos).xp,-(this_00->pos).yp);
      return this;
    }
  }
  else {
    puVar2 = &DAT_006f1ed0;
    pQVar3 = &QStack_c8;
    for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pQVar3 = *puVar2;
      puVar2 = puVar2 + 1;
      pQVar3 = (QTransform *)((long)pQVar3 + 8);
    }
    puVar2 = &DAT_006f1e88;
    pQVar3 = &QStack_c8;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pQVar3 = *puVar2;
      puVar2 = puVar2 + 1;
      pQVar3 = (QTransform *)((long)pQVar3 + 8);
    }
    QStack_c8._72_2_ = 0xa800;
    QGraphicsItemPrivate::combineTransformToParent(this_00,&QStack_c8,(QTransform *)0x0);
    QTransform::inverted(local_78);
    QTransform::map((QPainterPath *)this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QGraphicsItem::mapFromParent(const QPainterPath &path) const
{
    // COMBINE
    if (!d_ptr->transformData)
            return path.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().map(path);
}